

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int CountOccurrences(CommandLineArguments *args,char *arg)

{
  int iVar1;
  char *in_RSI;
  int *in_RDI;
  int num_occurences;
  int i;
  int local_18;
  int local_14;
  
  local_18 = 0;
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 2) + (long)local_14 * 8),in_RSI);
    if (iVar1 == 0) {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

static int CountOccurrences(const CommandLineArguments* const args,
                            const char* const arg) {
  int i;
  int num_occurences = 0;

  for (i = 0; i < args->argc_; ++i) {
    if (!strcmp(args->argv_[i], arg)) {
      ++num_occurences;
    }
  }
  return num_occurences;
}